

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# location.h
# Opt level: O2

basic_ostream<char,_std::char_traits<char>_> *
yy::operator<<(basic_ostream<char,_std::char_traits<char>_> *ostr,location *loc)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar2;
  ostream *poVar3;
  int iVar4;
  char cVar5;
  
  iVar1 = (loc->end).column;
  iVar4 = 0;
  if (0 < iVar1) {
    iVar4 = iVar1 + -1;
  }
  operator<<(ostr,&loc->begin);
  __rhs = (loc->end).filename;
  if ((__rhs == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) ||
     ((__lhs = (loc->begin).filename,
      __lhs != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0 &&
      (bVar2 = std::operator!=(__lhs,__rhs), !bVar2)))) {
    if ((loc->end).line <= (loc->begin).line) {
      if (iVar4 <= (loc->begin).column) {
        return ostr;
      }
      cVar5 = '-';
      poVar3 = ostr;
      goto LAB_00106a2e;
    }
    cVar5 = '-';
    poVar3 = ostr;
  }
  else {
    poVar3 = std::operator<<(ostr,'-');
    poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
    cVar5 = ':';
  }
  poVar3 = std::operator<<(poVar3,cVar5);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(loc->end).line);
  cVar5 = '.';
LAB_00106a2e:
  poVar3 = std::operator<<(poVar3,cVar5);
  std::ostream::operator<<((ostream *)poVar3,iVar4);
  return ostr;
}

Assistant:

std::basic_ostream<YYChar>&
  operator<< (std::basic_ostream<YYChar>& ostr, const location& loc)
  {
    location::counter_type end_col
      = 0 < loc.end.column ? loc.end.column - 1 : 0;
    ostr << loc.begin;
    if (loc.end.filename
        && (!loc.begin.filename
            || *loc.begin.filename != *loc.end.filename))
      ostr << '-' << loc.end.filename << ':' << loc.end.line << '.' << end_col;
    else if (loc.begin.line < loc.end.line)
      ostr << '-' << loc.end.line << '.' << end_col;
    else if (loc.begin.column < end_col)
      ostr << '-' << end_col;
    return ostr;
  }